

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O0

ValueCallback * __thiscall
SNMPAgent::addOpaqueHandler
          (SNMPAgent *this,char *oid,uint8_t *value,size_t data_len,bool isSettable,
          bool overwritePrefix)

{
  SortableOIDType *oid_00;
  OpaqueCallback *this_00;
  SortableOIDType *oidType;
  undefined4 uStack_30;
  bool overwritePrefix_local;
  bool isSettable_local;
  size_t data_len_local;
  uint8_t *value_local;
  char *oid_local;
  SNMPAgent *this_local;
  
  if (value == (uint8_t *)0x0) {
    this_local = (SNMPAgent *)0x0;
  }
  else {
    oid_00 = buildOIDWithPrefix(this,oid,overwritePrefix);
    if (oid_00 == (SortableOIDType *)0x0) {
      this_local = (SNMPAgent *)0x0;
    }
    else {
      this_00 = (OpaqueCallback *)operator_new(0x28);
      uStack_30 = (int)data_len;
      OpaqueCallback::OpaqueCallback(this_00,oid_00,value,uStack_30);
      this_local = (SNMPAgent *)addHandler(this,(ValueCallback *)this_00,isSettable);
    }
  }
  return (ValueCallback *)this_local;
}

Assistant:

ValueCallback* SNMPAgent::addOpaqueHandler(const char *oid, uint8_t* value, size_t data_len, bool isSettable, bool overwritePrefix){
    if(!value) return nullptr;

    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) return nullptr;
    return addHandler(new OpaqueCallback(oidType, value, data_len), isSettable);
}